

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::init(VertexCubeTextureCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  long lVar1;
  int i;
  int extraout_EAX;
  RenderTarget *pRVar2;
  ShaderProgram *this_00;
  TextureCube *this_01;
  NotSupportedError *pNVar3;
  int i_1;
  long lVar4;
  int i_9;
  long lVar5;
  Vec4 (*paVVar6) [2];
  pointer_____offset_0x10___ *ppuVar7;
  TextureFormatInfo *__return_storage_ptr__;
  int levelNdx;
  long lVar8;
  int face;
  Vec4 cScale;
  Vector<float,_4> res_3;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  Vec4 cBias;
  Vector<float,_4> res_4;
  Vector<float,_4> res_6;
  ProgramSources sources;
  value_type local_1a8;
  Vec4 local_188;
  float local_178 [4];
  Vec4 local_168;
  value_type local_158;
  Vec4 local_138;
  float local_128 [6];
  RGBA local_110 [4];
  undefined1 local_100 [16];
  undefined1 local_f0 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar2->m_numSamples != 0) {
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_100._0_8_ = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"MSAA config not supported by this test","");
    tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)local_100);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "attribute highp vec2 a_position;\nattribute highp vec3 a_texCoord;\nuniform highp samplerCube u_texture;\nuniform highp float u_lod;\nvarying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n}\n"
             ,"");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,
             "varying mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_FragColor = v_color;\n}\n","");
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100,&local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_f0 + 8),&local_1a8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_100);
  this->m_program = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar5 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((this->m_program->m_program).m_info.linkOk == true) {
    lVar5 = 0x12;
    do {
      this_01 = (TextureCube *)operator_new(0x180);
      glu::TextureCube::TextureCube
                (this_01,((this->super_TestCase).m_context)->m_renderCtx,0x1907,0x1401,0x20);
      (&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode)[lVar5] =
           (_func_int **)this_01;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 0x13);
    __return_storage_ptr__ = (TextureFormatInfo *)local_100;
    tcu::getTextureFormatInfo(__return_storage_ptr__,&(this->m_textures[0]->m_refTexture).m_format);
    local_158._M_dataplus._M_p = (pointer)local_100._0_8_;
    local_158._M_string_length = local_100._8_8_;
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    local_1a8._M_string_length = 0;
    lVar5 = 0;
    do {
      *(float *)((long)&local_1a8._M_dataplus._M_p + lVar5 * 4) =
           *(float *)(local_f0 + lVar5 * 4) - *(float *)(local_100 + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (init()::gradients == '\0') {
      init((EVP_PKEY_CTX *)__return_storage_ptr__);
    }
    paVVar6 = init::gradients;
    lVar5 = 0;
    do {
      lVar8 = 0;
      do {
        tcu::TextureCube::allocLevel(&this->m_textures[0]->m_refTexture,(CubeFace)lVar5,(int)lVar8);
        lVar1 = (long)(this->m_textures[0]->m_refTexture).m_access[lVar5].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_178[0] = 0.0;
        local_178[1] = 0.0;
        local_178[2] = 0.0;
        local_178[3] = 0.0;
        lVar4 = 0;
        do {
          local_178[lVar4] =
               (*paVVar6)[0].m_data[lVar4] *
               *(float *)((long)&local_1a8._M_dataplus._M_p + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_168.m_data[0] = 0.0;
        local_168.m_data[1] = 0.0;
        local_168.m_data[2] = 0.0;
        local_168.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_168.m_data[lVar4] =
               local_178[lVar4] + *(float *)((long)&local_158._M_dataplus._M_p + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_188.m_data[0] = 0.0;
        local_188.m_data[1] = 0.0;
        local_188.m_data[2] = 0.0;
        local_188.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_188.m_data[lVar4] =
               (*paVVar6)[1].m_data[lVar4] *
               *(float *)((long)&local_1a8._M_dataplus._M_p + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_138.m_data[0] = 0.0;
        local_138.m_data[1] = 0.0;
        local_138.m_data[2] = 0.0;
        local_138.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_138.m_data[lVar4] =
               local_188.m_data[lVar4] + *(float *)((long)&local_158._M_dataplus._M_p + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)(lVar1 + lVar8 * 0x28),&local_168,&local_138);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      lVar5 = lVar5 + 1;
      paVVar6 = paVVar6 + 1;
    } while (lVar5 != 6);
    lVar5 = 0;
    do {
      lVar8 = 0;
      do {
        tcu::TextureCube::allocLevel(&this->m_textures[1]->m_refTexture,(CubeFace)lVar5,(int)lVar8);
        lVar1 = (long)(this->m_textures[1]->m_refTexture).m_access[lVar5].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        tcu::RGBA::toVec((RGBA *)&local_138);
        local_178[0] = 0.0;
        local_178[1] = 0.0;
        local_178[2] = 0.0;
        local_178[3] = 0.0;
        lVar4 = 0;
        do {
          local_178[lVar4] =
               local_138.m_data[lVar4] * *(float *)((long)&local_1a8._M_dataplus._M_p + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_168.m_data[0] = 0.0;
        local_168.m_data[1] = 0.0;
        local_168.m_data[2] = 0.0;
        local_168.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_168.m_data[lVar4] =
               local_178[lVar4] + *(float *)((long)&local_158._M_dataplus._M_p + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        tcu::RGBA::toVec(local_110);
        local_128[0] = 0.0;
        local_128[1] = 0.0;
        local_128[2] = 0.0;
        local_128[3] = 0.0;
        lVar4 = 0;
        do {
          local_128[lVar4] =
               (float)local_110[lVar4].m_value *
               *(float *)((long)&local_1a8._M_dataplus._M_p + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        local_188.m_data[0] = 0.0;
        local_188.m_data[1] = 0.0;
        local_188.m_data[2] = 0.0;
        local_188.m_data[3] = 0.0;
        lVar4 = 0;
        do {
          local_188.m_data[lVar4] =
               local_128[lVar4] + *(float *)((long)&local_158._M_dataplus._M_p + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        tcu::fillWithGrid((PixelBufferAccess *)(lVar8 * 0x28 + lVar1),4,&local_168,&local_188);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    lVar5 = 0;
    do {
      glu::TextureCube::upload(this->m_textures[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    return extraout_EAX;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  glwGetIntegerv(0x8b4c,(GLint *)local_100);
  pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if ((int)local_100._0_4_ < 1) {
    tcu::NotSupportedError::NotSupportedError
              (pNVar3,"Vertex texture image units not supported",
               glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fVertexTextureTests.cpp"
               ,0x307);
    ppuVar7 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::TestError::TestError
              ((TestError *)pNVar3,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fVertexTextureTests.cpp"
               ,0x309);
    ppuVar7 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(pNVar3,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

void VertexCubeTextureCase::init (void)
{
	const char* const vertexShader =
		"attribute highp vec2 a_position;\n"
		"attribute highp vec3 a_texCoord;\n"
		"uniform highp samplerCube u_texture;\n"
		"uniform highp float u_lod;\n"
		"varying mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_color = textureCubeLod(u_texture, a_texCoord, u_lod);\n"
		"}\n";

	const char* const fragmentShader =
		"varying mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_FragColor = v_color;\n"
		"}\n";

	if (m_context.getRenderTarget().getNumSamples() != 0)
		throw tcu::NotSupportedError("MSAA config not supported by this test");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShader, fragmentShader));

	if(!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;

		GLint maxVertexTextures;
		glGetIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTextures);

		if (maxVertexTextures < 1)
			throw tcu::NotSupportedError("Vertex texture image units not supported", "", __FILE__, __LINE__);
		else
			TCU_FAIL("Failed to compile shader");
	}

	// Make the textures.
	try
	{
		// Compute suitable power-of-two sizes (for mipmaps).
		const int texWidth		= 1 << deLog2Ceil32(MAX_CUBE_RENDER_WIDTH / 3 / 2);
		const int texHeight		= 1 << deLog2Ceil32(MAX_CUBE_RENDER_HEIGHT / 2 / 2);

		DE_ASSERT(texWidth == texHeight);
		DE_UNREF(texHeight);

		for (int i = 0; i < 2; i++)
		{
			DE_ASSERT(!m_textures[i]);
			m_textures[i] = new glu::TextureCube(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, texWidth);
		}

		const bool						mipmaps		= deIsPowerOfTwo32(texWidth) != DE_FALSE;
		const int						numLevels	= mipmaps ? deLog2Floor32(texWidth)+1 : 1;
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
		const Vec4						cBias		= fmtInfo.valueMin;
		const Vec4						cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Fill first with gradient texture.
		static const Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ Vec4(-1.0f, -1.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ Vec4( 0.0f, -1.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ Vec4(-1.0f,  0.0f, -1.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ Vec4(-1.0f, -1.0f,  0.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ Vec4(-1.0f, -1.0f, -1.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ Vec4( 0.0f,  0.0f,  0.0f, 2.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				m_textures[0]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
			}
		}

		// Fill second with grid texture.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				const deUint32 step		= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
				const deUint32 rgb		= step*levelNdx*face;
				const deUint32 colorA	= 0xff000000 | rgb;
				const deUint32 colorB	= 0xff000000 | ~rgb;

				m_textures[1]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		for (int i = 0; i < 2; i++)
			m_textures[i]->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		VertexCubeTextureCase::deinit();
		throw;
	}
}